

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionEngine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::run(ExecutionEngine *this)

{
  int iVar1;
  reference pvVar2;
  Value v;
  Value_conflict VVar3;
  anon_struct_16_2_93c6670d local_38;
  ulong local_28;
  anon_union_8_3_805d2717_for_Value_1 local_20;
  int local_14;
  ExecutionEngine *pEStack_10;
  int i;
  ExecutionEngine *this_local;
  
  local_14 = 0;
  pEStack_10 = this;
  do {
    if (r.inSize <= local_14) {
      return;
    }
    iVar1 = r.instr[local_14];
    if (iVar1 == 0xf) {
      VVar3 = getCon();
      local_38.field_1 = VVar3.field_1;
      local_38.v = VVar3.v;
      std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::emplace<Value>(&vst,&local_38);
    }
    else if (iVar1 == 0x10) {
      pvVar2 = std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::top(&vst);
      local_28 = *(ulong *)pvVar2;
      local_20 = (anon_union_8_3_805d2717_for_Value_1)(pvVar2->field_1).cval;
      v._0_8_ = local_28 & 0xffffffff;
      v.field_1 = (anon_union_8_3_805d2717_for_Value_1)
                  (anon_union_8_3_805d2717_for_Value_1)local_20.cval;
      printVal(v);
      std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::pop(&vst);
    }
    else if (iVar1 == 0x11) {
      exit(0);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void ExecutionEngine::run() {
  for(int i = 0; i < r.inSize; i++) {
    switch(r.instr[i]) {
      case OP_PRINT:
      printVal(vst.top());
      vst.pop();
      break;
      case OP_LOAD:
      vst.emplace(getCon());
      break;
      case OP_RETURN:
      exit(0);
      break;
    }
  }
}